

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O0

bool __thiscall
ON_BinaryArchive::Write3dmReferencedComponentIndex
          (ON_BinaryArchive *this,ON_ModelComponent *model_component)

{
  ON_UUID model_id;
  bool bVar1;
  Type TVar2;
  int iVar3;
  ON_UUID *pOVar4;
  bool local_49;
  undefined1 local_30 [8];
  ON_UUID component_id;
  ON_ModelComponent *model_component_local;
  ON_BinaryArchive *this_local;
  
  component_id.Data4 = (uchar  [8])model_component;
  bVar1 = ReferencedComponentIndexMapping(this);
  if (bVar1) {
    pOVar4 = ON_ModelComponent::Id((ON_ModelComponent *)component_id.Data4);
    local_30._0_4_ = pOVar4->Data1;
    local_30._4_2_ = pOVar4->Data2;
    local_30._6_2_ = pOVar4->Data3;
    component_id._0_8_ = *(undefined8 *)pOVar4->Data4;
    bVar1 = ::operator==(&ON_nil_uuid,(ON_UUID_struct *)local_30);
    if (bVar1) {
      TVar2 = ON_ModelComponent::ComponentType((ON_ModelComponent *)component_id.Data4);
      iVar3 = ON_ModelComponent::Index((ON_ModelComponent *)component_id.Data4);
      local_49 = Write3dmReferencedComponentIndex(this,TVar2,iVar3);
    }
    else {
      TVar2 = ON_ModelComponent::ComponentType((ON_ModelComponent *)component_id.Data4);
      model_id.Data4 = (uchar  [8])component_id._0_8_;
      model_id.Data1 = local_30._0_4_;
      model_id.Data2 = local_30._4_2_;
      model_id.Data3 = local_30._6_2_;
      local_49 = Write3dmReferencedComponentIndex(this,TVar2,model_id);
    }
    this_local._7_1_ = local_49;
  }
  else {
    iVar3 = ON_ModelComponent::Index((ON_ModelComponent *)component_id.Data4);
    this_local._7_1_ = WriteInt(this,iVar3);
  }
  return this_local._7_1_;
}

Assistant:

bool ON_BinaryArchive::Write3dmReferencedComponentIndex(
  const ON_ModelComponent& model_component
  )
{
  if (ReferencedComponentIndexMapping())
  {
    // During writing, the m_manifest member stores 
    // the model id and index as the "Component" values and
    // the archive id and index as the "Manifest" values.
    const ON_UUID component_id = model_component.Id();
    return
      (ON_nil_uuid == component_id)
      ? Write3dmReferencedComponentIndex(model_component.ComponentType(), model_component.Index())
      : Write3dmReferencedComponentIndex(model_component.ComponentType(), component_id);
  }

  // no component mapping.
  return WriteInt(model_component.Index());
}